

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O0

bool glcts::verifyFace<float,1u,3u,3u>
               (float *data,GLuint cube_face,float *expected_values,GLuint image_width)

{
  bool bVar1;
  GLuint component;
  GLuint exp_pixel_offset;
  GLuint data_pixel_offset;
  GLuint x;
  GLuint exp_line_offset;
  GLuint data_line_offset;
  GLuint y;
  GLuint exp_size_of_line;
  GLuint data_size_of_line;
  GLuint exp_face_offset;
  GLuint data_face_offset;
  GLuint image_width_local;
  float *expected_values_local;
  GLuint cube_face_local;
  float *data_local;
  
  exp_line_offset = 0;
  do {
    if (2 < exp_line_offset) {
      return true;
    }
    for (exp_pixel_offset = 0; exp_pixel_offset < 3; exp_pixel_offset = exp_pixel_offset + 1) {
      bVar1 = false;
      while (!bVar1) {
        if ((data[exp_line_offset * image_width + cube_face * 3 + exp_pixel_offset] !=
             expected_values[exp_line_offset * 3 + cube_face * 9 + exp_pixel_offset]) ||
           (NAN(data[exp_line_offset * image_width + cube_face * 3 + exp_pixel_offset]) ||
            NAN(expected_values[exp_line_offset * 3 + cube_face * 9 + exp_pixel_offset]))) {
          return false;
        }
        bVar1 = true;
      }
    }
    exp_line_offset = exp_line_offset + 1;
  } while( true );
}

Assistant:

bool verifyFace(const T* data, const glw::GLuint cube_face, const T* expected_values, const glw::GLuint image_width)
{
	static const glw::GLuint size_of_pixel = N_Components;

	const glw::GLuint data_face_offset  = N_Components * Width * cube_face;
	const glw::GLuint exp_face_offset   = N_Components * Width * Height * cube_face;
	const glw::GLuint data_size_of_line = image_width * size_of_pixel;
	const glw::GLuint exp_size_of_line  = Width * size_of_pixel;

	for (glw::GLuint y = 0; y < Height; ++y)
	{
		const glw::GLuint data_line_offset = y * data_size_of_line;
		const glw::GLuint exp_line_offset  = y * exp_size_of_line;

		for (glw::GLuint x = 0; x < Width; ++x)
		{
			const glw::GLuint data_pixel_offset = data_line_offset + data_face_offset + x * size_of_pixel;
			const glw::GLuint exp_pixel_offset  = exp_line_offset + exp_face_offset + x * size_of_pixel;

			for (glw::GLuint component = 0; component < N_Components; ++component)
			{
				if (data[data_pixel_offset + component] != expected_values[exp_pixel_offset + component])
				{
					return false;
				}
			}
		}
	}

	return true;
}